

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

void after_read(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_shutdown_t *req;
  int64_t eval_b;
  int64_t eval_a;
  
  free(buf->base);
  req = (uv_shutdown_t *)malloc(0x58);
  iVar1 = uv_shutdown(req,handle,after_shutdown);
  if ((long)iVar1 == 0) {
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
          ,0x4c,"r","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

static void after_read(uv_stream_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  uv_shutdown_t* req;
  int r;

  if (buf->base) {
    free(buf->base);
  }

  req = (uv_shutdown_t*) malloc(sizeof *req);
  r = uv_shutdown(req, handle, after_shutdown);
  ASSERT_OK(r);
}